

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test::TestBody
          (BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test *this)

{
  bool bVar1;
  ParamType_conflict *pPVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  string str;
  CodedInputStream coded_input;
  ArrayInputStream input;
  AssertHelper local_e8;
  AssertHelper local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  ArrayInputStream *local_78;
  undefined7 local_70;
  undefined1 uStack_69;
  undefined7 uStack_68;
  undefined8 local_60;
  int local_58;
  int local_54;
  int local_50;
  DescriptorPool *local_48;
  MessageFactory *pMStack_40;
  ArrayInputStream local_38;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  io::(anonymous_namespace)::CodedStreamTest::buffer_ = 'S';
  DAT_019f3911 = 'o';
  DAT_019f3912 = 'm';
  DAT_019f3913 = 'e';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._3_1_ = ' ';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._4_1_ = 'b';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._5_1_ = 'y';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._6_1_ = 't';
  DAT_019f3918 = 'e';
  DAT_019f3918_1._0_1_ = 's';
  DAT_019f3918_1._1_1_ = ' ';
  DAT_019f3918_1._2_1_ = 'w';
  DAT_019f3918_1._3_1_ = 'h';
  DAT_019f3918_1._4_1_ = 'i';
  DAT_019f3918_1._5_1_ = 'c';
  DAT_019f3918_1._6_1_ = 'h';
  DAT_019f3920 = ' ';
  DAT_019f3920_1._0_1_ = 'w';
  DAT_019f3920_1._1_1_ = 'i';
  DAT_019f3920_1._2_1_ = 'l';
  DAT_019f3920_1._3_1_ = 'l';
  DAT_019f3920_1._4_1_ = ' ';
  DAT_019f3920_1._5_1_ = 'b';
  DAT_019f3920_1._6_1_ = 'e';
  uRam00000000019f3928 = 0x65747469727720;
  DAT_019f392f = 0x6e;
  _DAT_019f3930 = 0x657220646e6120;
  uRam00000000019f3937._0_1_ = 'a';
  uRam00000000019f3937._1_1_ = 'd';
  uRam00000000019f3937._2_1_ = ' ';
  uRam00000000019f3937._3_1_ = 'r';
  uRam00000000019f3937._4_1_ = 'a';
  uRam00000000019f3937._5_1_ = 'w';
  uRam00000000019f3937._6_1_ = '.';
  uRam00000000019f3937._7_1_ = '\0';
  ArrayInputStream::ArrayInputStream
            (&local_38,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*pPVar2);
  local_88 = (undefined1  [8])0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70 = 0;
  uStack_69 = 0;
  uStack_68._0_4_ = 0;
  uStack_68._4_1_ = false;
  uStack_68._5_1_ = false;
  uStack_68._6_1_ = false;
  local_60._0_4_ = 0x7fffffff;
  local_60._4_4_ = 0;
  local_58 = 0x7fffffff;
  local_54 = CodedInputStream::default_recursion_limit_;
  local_50 = CodedInputStream::default_recursion_limit_;
  local_48 = (DescriptorPool *)0x0;
  pMStack_40 = (MessageFactory *)0x0;
  local_78 = &local_38;
  CodedInputStream::Refresh((CodedInputStream *)local_88);
  CodedInputStream::SetTotalBytesLimit((CodedInputStream *)local_88,0x2f);
  local_d0 = (undefined1  [8])0x2f;
  local_e0.data_._0_4_ = CodedInputStream::BytesUntilTotalBytesLimit((CodedInputStream *)local_88);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_b0,"sizeof(kRawBytes)","coded_input.BytesUntilTotalBytesLimit()",
             (unsigned_long *)local_d0,(int *)&local_e0);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x32d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_d0 + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a0._M_local_buf[0] = '\0';
  local_b0 = (undefined1  [8])&local_a0;
  bVar1 = CodedInputStream::ReadString((CodedInputStream *)local_88,(string *)local_b0,0x2e);
  local_e0.data_._0_1_ = bVar1;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_e0,
               (AssertionResult *)"coded_input.ReadString(&str, strlen(kRawBytes))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x330,(char *)local_d0);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_d0 != (undefined1  [8])&local_c0) {
      operator_delete((void *)local_d0,local_c0._M_allocated_capacity + 1);
    }
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  local_e0.data_ = (AssertHelperData *)0x1;
  local_e8.data_._0_4_ = CodedInputStream::BytesUntilTotalBytesLimit((CodedInputStream *)local_88);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"sizeof(kRawBytes) - strlen(kRawBytes)",
             "coded_input.BytesUntilTotalBytesLimit()",(unsigned_long *)&local_e0,(int *)&local_e8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x332,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e0.data_ + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  testing::internal::CmpHelperEQ<char[47],std::__cxx11::string>
            ((internal *)local_d0,"kRawBytes","str",
             (char (*) [47])"Some bytes which will be written and read raw.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x333,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e0.data_ + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  local_e0.data_ = (AssertHelperData *)&DAT_0000000f;
  if (local_b0 != (undefined1  [8])&local_a0) {
    local_e0.data_ =
         (AssertHelperData *)CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0])
    ;
  }
  local_e8.data_ = (AssertHelperData *)0x2e;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)local_d0,"str.capacity()","strlen(kRawBytes)",(unsigned_long *)&local_e0,
             (unsigned_long *)&local_e8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x335,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e0.data_ + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  if (local_b0 != (undefined1  [8])&local_a0) {
    operator_delete((void *)local_b0,
                    CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
  }
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_88);
  local_b0 = (undefined1  [8])&DAT_0000002e;
  local_d0 = (undefined1  [8])ArrayInputStream::ByteCount(&local_38);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)local_88,"strlen(kRawBytes)","input.ByteCount()",(unsigned_long *)local_b0,
             (long *)local_d0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x338,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  return;
}

Assistant:

TEST_P(BlockSizes, ReadStringReservesMemoryOnTotalLimit) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kRawBytes, sizeof(kRawBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);
    coded_input.SetTotalBytesLimit(sizeof(kRawBytes));
    EXPECT_EQ(sizeof(kRawBytes), coded_input.BytesUntilTotalBytesLimit());

    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, strlen(kRawBytes)));
    EXPECT_EQ(sizeof(kRawBytes) - strlen(kRawBytes),
              coded_input.BytesUntilTotalBytesLimit());
    EXPECT_EQ(kRawBytes, str);
    // TODO: Replace with a more meaningful test (see cl/60966023).
    EXPECT_GE(str.capacity(), strlen(kRawBytes));
  }

  EXPECT_EQ(strlen(kRawBytes), input.ByteCount());
}